

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.h
# Opt level: O2

void write_v7m_exception_arm(CPUARMState *env,uint32_t new_exc)

{
  uint uVar1;
  uint32_t uVar2;
  byte bVar3;
  ulong uVar4;
  
  if ((env->v7m).exception == 0) {
    uVar4 = (ulong)(env->v7m).secure;
    uVar1 = (env->v7m).control[uVar4];
    (env->v7m).exception = new_exc;
    if (new_exc != 0) {
      if ((uVar1 & 2) == 0) {
        return;
      }
      goto LAB_0053bea2;
    }
    bVar3 = (byte)((uVar1 & 2) >> 1);
  }
  else {
    (env->v7m).exception = new_exc;
    if (new_exc != 0) {
      return;
    }
    uVar4 = (ulong)(env->v7m).secure;
    bVar3 = 0;
  }
  if (bVar3 == ((byte)(env->v7m).control[uVar4] & 2) >> 1) {
    return;
  }
LAB_0053bea2:
  uVar2 = (env->v7m).other_sp;
  (env->v7m).other_sp = env->regs[0xd];
  env->regs[0xd] = uVar2;
  return;
}

Assistant:

static inline bool arm_v7m_is_handler_mode(CPUARMState *env)
{
    return env->v7m.exception != 0;
}